

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregoimp.cpp
# Opt level: O1

int32_t icu_63::Grego::dayOfWeekInMonth(int32_t year,int32_t month,int32_t dom)

{
  uint uVar1;
  int32_t iVar2;
  uint uVar3;
  int iVar4;
  
  if (dom - 0x16U < 7) {
    uVar1 = 0;
    if ((year & 3U) == 0) {
      uVar3 = year * -0x3d70a3d7 + 0x51eb850;
      uVar1 = 0xc;
      if ((uVar3 >> 2 | year * 0x40000000) < 0x28f5c29) {
        uVar1 = 0xc;
        if (0xa3d70a < (uVar3 >> 4 | year * -0x70000000)) {
          uVar1 = 0;
        }
      }
    }
    return (uint)(dom + 7 <= (int)(char)MONTH_LENGTH[(long)month + (ulong)uVar1]) * 5 + -1;
  }
  iVar4 = (int)((ulong)((long)(dom + 6) * -0x6db6db6d) >> 0x20) + dom + 6;
  iVar2 = -1;
  if (6 < dom - 0x1dU) {
    iVar2 = (iVar4 >> 2) - (iVar4 >> 0x1f);
  }
  return iVar2;
}

Assistant:

int32_t Grego::dayOfWeekInMonth(int32_t year, int32_t month, int32_t dom) {
    int32_t weekInMonth = (dom + 6)/7;
    if (weekInMonth == 4) {
        if (dom + 7 > monthLength(year, month)) {
            weekInMonth = -1;
        }
    } else if (weekInMonth == 5) {
        weekInMonth = -1;
    }
    return weekInMonth;
}